

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,int num_planes)

{
  int in_stack_00000060;
  int in_stack_00000064;
  YV12_BUFFER_CONFIG *in_stack_00000068;
  
  extend_frame(in_stack_00000068,in_stack_00000064,in_stack_00000060);
  return;
}

Assistant:

void aom_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf, const int num_planes) {
  extend_frame(ybf, ybf->border, num_planes);
}